

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareSourceTexture
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  TextureInternalFormatDescriptor descriptor_00;
  TextureInternalFormatDescriptor descriptor_01;
  TextureInternalFormatDescriptor descriptor_02;
  TextureInternalFormatDescriptor descriptor_03;
  TextureInternalFormatDescriptor descriptor_04;
  TextureInternalFormatDescriptor descriptor_05;
  TextureInternalFormatDescriptor descriptor_06;
  TextureInternalFormatDescriptor descriptor_07;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined4 uVar6;
  undefined8 local_238 [3];
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8 [3];
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8 [3];
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178 [3];
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138 [3];
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8 [3];
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8 [3];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78 [3];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  GLenum source_format;
  GLenum source_type;
  GLvoid *source_data;
  Functions *gl;
  FunctionalTest *pFStack_18;
  GLenum target_local;
  FunctionalTest *this_local;
  
  gl._4_4_ = target;
  pFStack_18 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  source_data = (GLvoid *)CONCAT44(extraout_var,iVar2);
  (**(code **)((long)source_data + 0x6f8))(1,&this->m_source_texture);
  dVar3 = (**(code **)((long)source_data + 0x800))();
  glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0xe9);
  (**(code **)((long)source_data + 0xb8))(gl._4_4_,this->m_source_texture);
  dVar3 = (**(code **)((long)source_data + 0x800))();
  glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0xec);
  _source_format = (undefined1 *)0x0;
  local_34 = 0;
  local_38 = 0x1908;
  memcpy(local_78,&descriptor,0x40);
  uVar6 = (undefined4)local_78[2];
  descriptor_00.internal_format_name._0_4_ = (int)local_78[1];
  descriptor_00.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_78[0]
  ;
  descriptor_00.internal_format = local_78[0]._4_4_;
  descriptor_00.internal_format_name._4_4_ = (int)((ulong)local_78[1] >> 0x20);
  descriptor_00.is_sRGB = (bool)(char)uVar6;
  descriptor_00.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
  descriptor_00._18_2_ = (short)((uint)uVar6 >> 0x10);
  descriptor_00.min_red_size = (int)((ulong)local_78[2] >> 0x20);
  descriptor_00.min_green_size = (undefined4)uStack_60;
  descriptor_00.min_blue_size = uStack_60._4_4_;
  descriptor_00.min_alpha_size = (undefined4)local_58;
  descriptor_00.min_depth_size = local_58._4_4_;
  descriptor_00.min_stencil_size = (undefined4)uStack_50;
  descriptor_00.expected_red_type = uStack_50._4_4_;
  descriptor_00.expected_green_type = (undefined4)local_48;
  descriptor_00.expected_blue_type = local_48._4_4_;
  descriptor_00.expected_alpha_type = (undefined4)uStack_40;
  descriptor_00.expected_depth_type = uStack_40._4_4_;
  bVar1 = isFloatType(this,descriptor_00);
  if (bVar1) {
    _source_format = s_source_texture_data_f;
    local_34 = 0x1406;
    local_38 = 0x1908;
  }
  else {
    memcpy(local_b8,&descriptor,0x40);
    uVar6 = (undefined4)local_b8[2];
    descriptor_01.internal_format_name._0_4_ = (int)local_b8[1];
    descriptor_01.required_by_context.super_ApiType.m_bits =
         (ApiType)(ApiType)(undefined4)local_b8[0];
    descriptor_01.internal_format = local_b8[0]._4_4_;
    descriptor_01.internal_format_name._4_4_ = (int)((ulong)local_b8[1] >> 0x20);
    descriptor_01.is_sRGB = (bool)(char)uVar6;
    descriptor_01.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
    descriptor_01._18_2_ = (short)((uint)uVar6 >> 0x10);
    descriptor_01.min_red_size = (int)((ulong)local_b8[2] >> 0x20);
    descriptor_01.min_green_size = (undefined4)uStack_a0;
    descriptor_01.min_blue_size = uStack_a0._4_4_;
    descriptor_01.min_alpha_size = (undefined4)local_98;
    descriptor_01.min_depth_size = local_98._4_4_;
    descriptor_01.min_stencil_size = (undefined4)uStack_90;
    descriptor_01.expected_red_type = uStack_90._4_4_;
    descriptor_01.expected_green_type = (undefined4)local_88;
    descriptor_01.expected_blue_type = local_88._4_4_;
    descriptor_01.expected_alpha_type = (undefined4)uStack_80;
    descriptor_01.expected_depth_type = uStack_80._4_4_;
    bVar1 = isFixedSignedType(this,descriptor_01);
    if (bVar1) {
      _source_format = s_source_texture_data_sn;
      local_34 = 0x1406;
      local_38 = 0x1908;
    }
    else {
      memcpy(local_f8,&descriptor,0x40);
      uVar6 = (undefined4)local_f8[2];
      descriptor_02.internal_format_name._0_4_ = (int)local_f8[1];
      descriptor_02.required_by_context.super_ApiType.m_bits =
           (ApiType)(ApiType)(undefined4)local_f8[0];
      descriptor_02.internal_format = local_f8[0]._4_4_;
      descriptor_02.internal_format_name._4_4_ = (int)((ulong)local_f8[1] >> 0x20);
      descriptor_02.is_sRGB = (bool)(char)uVar6;
      descriptor_02.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
      descriptor_02._18_2_ = (short)((uint)uVar6 >> 0x10);
      descriptor_02.min_red_size = (int)((ulong)local_f8[2] >> 0x20);
      descriptor_02.min_green_size = (undefined4)uStack_e0;
      descriptor_02.min_blue_size = uStack_e0._4_4_;
      descriptor_02.min_alpha_size = (undefined4)local_d8;
      descriptor_02.min_depth_size = local_d8._4_4_;
      descriptor_02.min_stencil_size = (undefined4)uStack_d0;
      descriptor_02.expected_red_type = uStack_d0._4_4_;
      descriptor_02.expected_green_type = (undefined4)local_c8;
      descriptor_02.expected_blue_type = local_c8._4_4_;
      descriptor_02.expected_alpha_type = (undefined4)uStack_c0;
      descriptor_02.expected_depth_type = uStack_c0._4_4_;
      bVar1 = isFixedUnsignedType(this,descriptor_02);
      if (bVar1) {
        _source_format = s_source_texture_data_n;
        local_34 = 0x1406;
        local_38 = 0x1908;
      }
      else {
        memcpy(local_138,&descriptor,0x40);
        uVar6 = (undefined4)local_138[2];
        descriptor_03.internal_format_name._0_4_ = (int)local_138[1];
        descriptor_03.required_by_context.super_ApiType.m_bits =
             (ApiType)(ApiType)(undefined4)local_138[0];
        descriptor_03.internal_format = local_138[0]._4_4_;
        descriptor_03.internal_format_name._4_4_ = (int)((ulong)local_138[1] >> 0x20);
        descriptor_03.is_sRGB = (bool)(char)uVar6;
        descriptor_03.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
        descriptor_03._18_2_ = (short)((uint)uVar6 >> 0x10);
        descriptor_03.min_red_size = (int)((ulong)local_138[2] >> 0x20);
        descriptor_03.min_green_size = (undefined4)uStack_120;
        descriptor_03.min_blue_size = uStack_120._4_4_;
        descriptor_03.min_alpha_size = (undefined4)local_118;
        descriptor_03.min_depth_size = local_118._4_4_;
        descriptor_03.min_stencil_size = (undefined4)uStack_110;
        descriptor_03.expected_red_type = uStack_110._4_4_;
        descriptor_03.expected_green_type = (undefined4)local_108;
        descriptor_03.expected_blue_type = local_108._4_4_;
        descriptor_03.expected_alpha_type = (undefined4)uStack_100;
        descriptor_03.expected_depth_type = uStack_100._4_4_;
        bVar1 = isIntegerSignedType(this,descriptor_03);
        if (bVar1) {
          _source_format = s_source_texture_data_i;
          local_34 = 0x1404;
          local_38 = 0x8d99;
        }
        else {
          memcpy(local_178,&descriptor,0x40);
          uVar6 = (undefined4)local_178[2];
          descriptor_04.internal_format_name._0_4_ = (int)local_178[1];
          descriptor_04.required_by_context.super_ApiType.m_bits =
               (ApiType)(ApiType)(undefined4)local_178[0];
          descriptor_04.internal_format = local_178[0]._4_4_;
          descriptor_04.internal_format_name._4_4_ = (int)((ulong)local_178[1] >> 0x20);
          descriptor_04.is_sRGB = (bool)(char)uVar6;
          descriptor_04.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
          descriptor_04._18_2_ = (short)((uint)uVar6 >> 0x10);
          descriptor_04.min_red_size = (int)((ulong)local_178[2] >> 0x20);
          descriptor_04.min_green_size = (undefined4)uStack_160;
          descriptor_04.min_blue_size = uStack_160._4_4_;
          descriptor_04.min_alpha_size = (undefined4)local_158;
          descriptor_04.min_depth_size = local_158._4_4_;
          descriptor_04.min_stencil_size = (undefined4)uStack_150;
          descriptor_04.expected_red_type = uStack_150._4_4_;
          descriptor_04.expected_green_type = (undefined4)local_148;
          descriptor_04.expected_blue_type = local_148._4_4_;
          descriptor_04.expected_alpha_type = (undefined4)uStack_140;
          descriptor_04.expected_depth_type = uStack_140._4_4_;
          bVar1 = isIntegerUnsignedType(this,descriptor_04);
          if (bVar1) {
            _source_format = s_source_texture_data_ui;
            local_34 = 0x1405;
            local_38 = 0x8d99;
          }
          else {
            memcpy(local_1b8,&descriptor,0x40);
            uVar6 = (undefined4)local_1b8[2];
            descriptor_05.internal_format_name._0_4_ = (int)local_1b8[1];
            descriptor_05.required_by_context.super_ApiType.m_bits =
                 (ApiType)(ApiType)(undefined4)local_1b8[0];
            descriptor_05.internal_format = local_1b8[0]._4_4_;
            descriptor_05.internal_format_name._4_4_ = (int)((ulong)local_1b8[1] >> 0x20);
            descriptor_05.is_sRGB = (bool)(char)uVar6;
            descriptor_05.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
            descriptor_05._18_2_ = (short)((uint)uVar6 >> 0x10);
            descriptor_05.min_red_size = (int)((ulong)local_1b8[2] >> 0x20);
            descriptor_05.min_green_size = (undefined4)uStack_1a0;
            descriptor_05.min_blue_size = uStack_1a0._4_4_;
            descriptor_05.min_alpha_size = (undefined4)local_198;
            descriptor_05.min_depth_size = local_198._4_4_;
            descriptor_05.min_stencil_size = (undefined4)uStack_190;
            descriptor_05.expected_red_type = uStack_190._4_4_;
            descriptor_05.expected_green_type = (undefined4)local_188;
            descriptor_05.expected_blue_type = local_188._4_4_;
            descriptor_05.expected_alpha_type = (undefined4)uStack_180;
            descriptor_05.expected_depth_type = uStack_180._4_4_;
            bVar1 = isDepthType(this,descriptor_05);
            if (bVar1) {
              _source_format = (undefined1 *)0x0;
              local_34 = 0x1405;
              local_38 = 0x1902;
            }
            else {
              memcpy(local_1f8,&descriptor,0x40);
              uVar6 = (undefined4)local_1f8[2];
              descriptor_06.internal_format_name._0_4_ = (int)local_1f8[1];
              descriptor_06.required_by_context.super_ApiType.m_bits =
                   (ApiType)(ApiType)(undefined4)local_1f8[0];
              descriptor_06.internal_format = local_1f8[0]._4_4_;
              descriptor_06.internal_format_name._4_4_ = (int)((ulong)local_1f8[1] >> 0x20);
              descriptor_06.is_sRGB = (bool)(char)uVar6;
              descriptor_06.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
              descriptor_06._18_2_ = (short)((uint)uVar6 >> 0x10);
              descriptor_06.min_red_size = (int)((ulong)local_1f8[2] >> 0x20);
              descriptor_06.min_green_size = (undefined4)uStack_1e0;
              descriptor_06.min_blue_size = uStack_1e0._4_4_;
              descriptor_06.min_alpha_size = (undefined4)local_1d8;
              descriptor_06.min_depth_size = local_1d8._4_4_;
              descriptor_06.min_stencil_size = (undefined4)uStack_1d0;
              descriptor_06.expected_red_type = uStack_1d0._4_4_;
              descriptor_06.expected_green_type = (undefined4)local_1c8;
              descriptor_06.expected_blue_type = local_1c8._4_4_;
              descriptor_06.expected_alpha_type = (undefined4)uStack_1c0;
              descriptor_06.expected_depth_type = uStack_1c0._4_4_;
              bVar1 = isStencilType(this,descriptor_06);
              if (bVar1) {
                _source_format = (undefined1 *)0x0;
                local_34 = 0x1405;
                local_38 = 0x1901;
              }
            }
          }
        }
      }
    }
  }
  if (gl._4_4_ == 0xde0) {
    (**(code **)((long)source_data + 0x1308))
              (0xde0,0,descriptor.internal_format,1,0,local_38,local_34,(int)_source_format);
    dVar3 = (**(code **)((long)source_data + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x136);
    return;
  }
  if (gl._4_4_ == 0xde1) {
LAB_00e10acb:
    (**(code **)((long)source_data + 0x1310))
              (gl._4_4_,0,descriptor.internal_format,1,1,0,local_38,local_34,(int)_source_format);
    dVar3 = (**(code **)((long)source_data + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x13d);
  }
  else {
    if (gl._4_4_ != 0x806f) {
      if ((gl._4_4_ == 0x84f5) || (gl._4_4_ == 0x8c18)) goto LAB_00e10acb;
      if (gl._4_4_ != 0x8c1a) {
        if ((gl._4_4_ != 0x9100) && (gl._4_4_ != 0x9102)) {
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 0;
          __cxa_throw(puVar5,&int::typeinfo,0);
        }
        memcpy(local_238,&descriptor,0x40);
        uVar6 = (undefined4)local_238[2];
        descriptor_07.internal_format_name._0_4_ = (int)local_238[1];
        descriptor_07.required_by_context.super_ApiType.m_bits =
             (ApiType)(ApiType)(undefined4)local_238[0];
        descriptor_07.internal_format = local_238[0]._4_4_;
        descriptor_07.internal_format_name._4_4_ = (int)((ulong)local_238[1] >> 0x20);
        descriptor_07.is_sRGB = (bool)(char)uVar6;
        descriptor_07.is_color_renderable = (bool)(char)((uint)uVar6 >> 8);
        descriptor_07._18_2_ = (short)((uint)uVar6 >> 0x10);
        descriptor_07.min_red_size = (int)((ulong)local_238[2] >> 0x20);
        descriptor_07.min_green_size = (undefined4)uStack_220;
        descriptor_07.min_blue_size = uStack_220._4_4_;
        descriptor_07.min_alpha_size = (undefined4)local_218;
        descriptor_07.min_depth_size = local_218._4_4_;
        descriptor_07.min_stencil_size = (undefined4)uStack_210;
        descriptor_07.expected_red_type = uStack_210._4_4_;
        descriptor_07.expected_green_type = (undefined4)local_208;
        descriptor_07.expected_blue_type = local_208._4_4_;
        descriptor_07.expected_alpha_type = (undefined4)uStack_200;
        descriptor_07.expected_depth_type = uStack_200._4_4_;
        renderDataIntoMultisampledTexture(this,descriptor_07,gl._4_4_);
        return;
      }
    }
    (**(code **)((long)source_data + 0x1320))
              (gl._4_4_,0,descriptor.internal_format,1,1,1,0,local_38,local_34,_source_format);
    dVar3 = (**(code **)((long)source_data + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x143);
  }
  return;
}

Assistant:

void FunctionalTest::prepareSourceTexture(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create and bind texture object. */
	gl.genTextures(1, &m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	gl.bindTexture(target, m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* Select proper data set. */
	glw::GLvoid* source_data   = DE_NULL;
	glw::GLenum  source_type   = GL_NONE;
	glw::GLenum  source_format = GL_RGBA;

	if (isFloatType(descriptor)) /* For floating type. */
	{
		source_data   = (glw::GLvoid*)s_source_texture_data_f;
		source_type   = GL_FLOAT;
		source_format = GL_RGBA;
	}
	else
	{
		if (isFixedSignedType(descriptor)) /* For fixed signed type. */
		{
			source_data   = (glw::GLvoid*)s_source_texture_data_sn;
			source_type   = GL_FLOAT;
			source_format = GL_RGBA;
		}
		else
		{
			if (isFixedUnsignedType(descriptor)) /* For fixed unsigned type. */
			{
				source_data   = (glw::GLvoid*)s_source_texture_data_n;
				source_type   = GL_FLOAT;
				source_format = GL_RGBA;
			}
			else
			{
				if (isIntegerSignedType(descriptor)) /* For integral signed type. */
				{
					source_data   = (glw::GLvoid*)s_source_texture_data_i;
					source_type   = GL_INT;
					source_format = GL_RGBA_INTEGER;
				}
				else
				{
					if (isIntegerUnsignedType(descriptor)) /* For integral unsigned type. */
					{
						source_data   = (glw::GLvoid*)s_source_texture_data_ui;
						source_type   = GL_UNSIGNED_INT;
						source_format = GL_RGBA_INTEGER;
					}
					else
					{
						if (isDepthType(descriptor)) /* For depth type. */
						{
							source_data   = NULL;
							source_type   = GL_UNSIGNED_INT;
							source_format = GL_DEPTH_COMPONENT;
						}
						else
						{
							if (isStencilType(descriptor)) /* For stencil type. */
							{
								source_data   = NULL;
								source_type   = GL_UNSIGNED_INT;
								source_format = GL_STENCIL_INDEX;
							}
						}
					}
				}
			}
		}
	}

	/* Prepare texture storage depending on the target. */
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texImage1D(target, 0, descriptor.internal_format, s_source_texture_size, 0, source_format, source_type,
					  source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texImage2D(target, 0, descriptor.internal_format, s_source_texture_size, s_source_texture_size, 0,
					  source_format, source_type, source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texImage3D(target, 0, descriptor.internal_format, s_source_texture_size, s_source_texture_size,
					  s_source_texture_size, 0, source_format, source_type, source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		renderDataIntoMultisampledTexture(descriptor, target);
		break;
	default:
		throw 0;
	}
}